

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

void __thiscall hnsw::HNSWIndex::SearchUpperLayer(HNSWIndex *this,float *q,Point *ep,layer_t layer)

{
  bool bVar1;
  reference this_00;
  reference ppVar2;
  float *pfVar3;
  int in_ECX;
  uint *in_RDX;
  Matrix *in_RSI;
  long in_RDI;
  float fVar4;
  float dist;
  pair<unsigned_int,_float> *neighbor;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type *neighbors;
  bool is_closer;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff98;
  Matrix *in_stack_ffffffffffffffa0;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_38;
  reference local_30;
  reference local_28;
  byte local_1d;
  int local_1c;
  uint *local_18;
  Matrix *local_10;
  
  local_1d = 1;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while ((local_1d & 1) != 0) {
    local_1d = 0;
    this_00 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
              operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                          *)(in_RDI + 0x30),(ulong)*local_18);
    local_30 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[](&this_00->neighbors,(long)local_1c);
    local_28 = local_30;
    local_38._M_current =
         (pair<unsigned_int,_float> *)
         std::
         vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
         begin(in_stack_ffffffffffffff98);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
               ::operator*(&local_38);
      in_stack_ffffffffffffff98 =
           *(vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             **)(in_RDI + 0xb8);
      in_stack_ffffffffffffffa0 = local_10;
      pfVar3 = Matrix::operator[](local_10,(size_t)in_stack_ffffffffffffff98);
      fVar4 = (float)(*(code *)*(in_stack_ffffffffffffff98->
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)
                               (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,pfVar3);
      if (fVar4 < (float)local_18[1]) {
        local_1d = 1;
        local_18[1] = (uint)fVar4;
        *local_18 = ppVar2->first;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void SearchUpperLayer(const float *q, Point &ep, layer_t layer) {
    bool is_closer = true;
    while (is_closer) {
      is_closer = false;
      const auto &neighbors = vertices_[ep.first].neighbors[layer];
      for (const auto &neighbor : neighbors) {
        float dist = distance_(q, points_[neighbor.first]);
        if (dist < ep.second) {
          is_closer = true;
          ep.second = dist;
          ep.first = neighbor.first;
        }
      }
    }
  }